

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

int32_t __thiscall icu_63::NFRule::indexOfAnyRulePrefix(NFRule *this)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -1;
  for (lVar4 = 0; lVar4 != 0x58; lVar4 = lVar4 + 8) {
    iVar1 = UnicodeString::indexOf(&this->fRuleText,**(char16_t **)((long)&RULE_PREFIXES + lVar4));
    iVar2 = iVar3;
    if (iVar1 < iVar3) {
      iVar2 = iVar1;
    }
    if (iVar3 == -1) {
      iVar2 = iVar1;
    }
    if (iVar1 != -1) {
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int32_t
NFRule::indexOfAnyRulePrefix() const
{
    int result = -1;
    for (int i = 0; RULE_PREFIXES[i]; i++) {
        int32_t pos = fRuleText.indexOf(*RULE_PREFIXES[i]);
        if (pos != -1 && (result == -1 || pos < result)) {
            result = pos;
        }
    }
    return result;
}